

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O1

IterationRequest __thiscall
helics::CallbackFederate::initializeOperationsCallback(CallbackFederate *this)

{
  IterationRequest IVar1;
  Federate *this_00;
  
  this_00 = (Federate *)
            ((long)&(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate +
            (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]);
  if ((this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]
      [(long)&(this->super_CombinationFederate).super_ValueFederate.vfManager._M_t] ==
      (_func_int)0x0) {
    Federate::enteringInitializingMode(this_00,NEXT_STEP);
  }
  else {
    Federate::enteringExecutingMode(this_00,(iteration_time)(ZEXT816(2) << 0x40));
  }
  if (*(long *)&(this->super_CombinationFederate).super_ValueFederate.field_0x48 != 0) {
    IVar1 = (**(code **)&(this->super_CombinationFederate).super_ValueFederate.field_0x50)
                      (&(this->super_CombinationFederate).super_ValueFederate.field_0x38);
    return IVar1;
  }
  return NO_ITERATIONS;
}

Assistant:

IterationRequest CallbackFederate::initializeOperationsCallback()
{
    if (currentMode.load() == Modes::STARTUP) {
        enteringInitializingMode(IterationResult::NEXT_STEP);
    } else {
        enteringExecutingMode({timeZero, IterationResult::ITERATING});
    }

    return (initializationOperation) ? initializationOperation() : IterationRequest::NO_ITERATIONS;
}